

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHeader.cpp
# Opt level: O0

void __thiscall KDReports::Header::Header(Header *this,Report *report)

{
  HeaderPrivate *this_00;
  pointer this_01;
  QTextDocument *pQVar1;
  pointer pRVar2;
  QFont local_38 [32];
  Report *local_18;
  Report *report_local;
  Header *this_local;
  
  local_18 = report;
  report_local = (Report *)this;
  this_00 = (HeaderPrivate *)operator_new(0xd8);
  HeaderPrivate::HeaderPrivate(this_00,local_18);
  std::unique_ptr<KDReports::HeaderPrivate,std::default_delete<KDReports::HeaderPrivate>>::
  unique_ptr<std::default_delete<KDReports::HeaderPrivate>,void>
            ((unique_ptr<KDReports::HeaderPrivate,std::default_delete<KDReports::HeaderPrivate>> *)
             this,this_00);
  this_01 = std::
            unique_ptr<KDReports::HeaderPrivate,_std::default_delete<KDReports::HeaderPrivate>_>::
            operator->(&this->d);
  pQVar1 = TextDocument::contentDocument(&this_01->m_textDocument);
  pRVar2 = std::unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
           ::operator->(&local_18->d);
  (*pRVar2->m_layout->_vptr_AbstractReportLayout[4])(local_38);
  QTextDocument::setDefaultFont((QFont *)pQVar1);
  QFont::~QFont(local_38);
  return;
}

Assistant:

KDReports::Header::Header(KDReports::Report *report)
    : d(new HeaderPrivate(report))
{
    d->m_textDocument.contentDocument().setDefaultFont(report->d->m_layout->defaultFont());
}